

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O0

float128 float128_silence_nan_ppc(float128 a,float_status *status)

{
  flag fVar1;
  float_status *status_local;
  float128 a_local;
  undefined8 local_10;
  
  fVar1 = snan_bit_is_one(status);
  if (fVar1 == '\0') {
    local_10 = a.high | 0x800000000000;
    a_local.high = a.low;
  }
  else {
    join_0x00000010_0x00000000_ = float128_default_nan_ppc(status);
  }
  return stack0xffffffffffffffe8;
}

Assistant:

float128 float128_silence_nan(float128 a, float_status *status)
{
#ifdef NO_SIGNALING_NANS
    g_assert_not_reached();
#else
    if (snan_bit_is_one(status)) {
        return float128_default_nan(status);
    } else {
        a.high |= UINT64_C(0x0000800000000000);
        return a;
    }
#endif
}